

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::editMoveNextWord(Cmd *this,State *state)

{
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  size_type sVar6;
  string sStack_98;
  char acStack_78 [72];
  
  uVar1 = (state->buf)._M_string_length;
  uVar3 = state->pos;
  if (uVar3 < uVar1) {
    pcVar5 = (state->buf)._M_dataplus._M_p;
    do {
      if (pcVar5[uVar3] != ' ') goto LAB_0010472c;
      uVar3 = uVar3 + 1;
      state->pos = uVar3;
    } while (uVar1 != uVar3);
  }
  else {
LAB_0010472c:
    if (uVar1 <= uVar3) {
code_r0x00104584:
      if (this->multiline_mode != true) {
        sVar2 = (this->prompt)._M_string_length;
        pcVar5 = (state->buf)._M_dataplus._M_p;
        sVar6 = (state->buf)._M_string_length;
        sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
        sStack_98._M_string_length = 0;
        sStack_98.field_2._M_local_buf[0] = '\0';
        uVar1 = state->cols;
        uVar4 = state->pos + sVar2;
        uVar3 = uVar4;
        if (uVar1 <= uVar4) {
          uVar3 = uVar1 - 1;
          if (uVar4 - 1 < uVar1 - 1) {
            uVar3 = uVar4 - 1;
          }
          sVar6 = (sVar6 + uVar3) - uVar4;
          pcVar5 = pcVar5 + (uVar4 - uVar3);
        }
        uVar4 = sVar6 + sVar2;
        if (uVar1 < sVar6 + sVar2) {
          uVar4 = uVar1;
        }
        std::__cxx11::string::append((char *)&sStack_98);
        std::__cxx11::string::_M_append((char *)&sStack_98,(ulong)(this->prompt)._M_dataplus._M_p);
        if (state->mask_mode == true) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&sStack_98,sStack_98._M_string_length,0,(char)uVar4 - (char)sVar2);
        }
        else {
          std::__cxx11::string::append((char *)&sStack_98,(ulong)pcVar5);
        }
        refreshShowHints(this,&sStack_98,state,(int)sVar2);
        std::__cxx11::string::append((char *)&sStack_98);
        snprintf(acStack_78,0x40,"\r\x1b[%dC",uVar3 & 0xffffffff);
        std::__cxx11::string::append((char *)&sStack_98);
        write(this->out_fd_,sStack_98._M_dataplus._M_p,sStack_98._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_98._M_dataplus._M_p != &sStack_98.field_2) {
          operator_delete(sStack_98._M_dataplus._M_p,
                          CONCAT71(sStack_98.field_2._M_allocated_capacity._1_7_,
                                   sStack_98.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      refreshMultiLine(this,state);
      return;
    }
    pcVar5 = (state->buf)._M_dataplus._M_p;
    do {
      uVar4 = uVar3 + 1;
      if (pcVar5[uVar3] == ' ') goto code_r0x00104584;
      state->pos = uVar4;
      uVar3 = uVar4;
    } while (uVar4 != uVar1);
  }
  refreshLine(this,state);
  return;
}

Assistant:

void editMoveNextWord(State *state) {
		while (state->pos < state->buf.size() && state->buf[state->pos] == ' ')
			state->pos++;

		while (state->pos < state->buf.size() && state->buf[state->pos] != ' ')
			state->pos++;

		refreshLine(state);
	}